

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_array.cpp
# Opt level: O0

void __thiscall
VertexArray::add_vertex_buffer(VertexArray *this,shared_ptr<VertexBuffer> *vbo,bool instanced)

{
  ElementType EVar1;
  GLuint GVar2;
  PFNGLVERTEXATTRIBPOINTERPROC p_Var3;
  bool bVar4;
  uint32_t uVar5;
  GLenum GVar6;
  uint32_t uVar7;
  element_type *peVar8;
  BufferLayout *this_00;
  reference this_01;
  socklen_t sVar9;
  uint uVar10;
  ulong in_RCX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int iVar11;
  __normal_iterator<const_BufferElement_*,_std::vector<BufferElement,_std::allocator<BufferElement>_>_>
  *__rhs;
  byte local_4a;
  uint8_t i;
  uint8_t count;
  BufferElement *e;
  const_iterator __end1;
  const_iterator __begin1;
  BufferLayout *__range1;
  BufferLayout *layout;
  bool instanced_local;
  shared_ptr<VertexBuffer> *vbo_local;
  VertexArray *this_local;
  shared_ptr<VertexBuffer> *psVar12;
  
  psVar12 = vbo;
  peVar8 = std::__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )vbo);
  iVar11 = (int)psVar12;
  this_00 = VertexBuffer::layout(peVar8);
  bind(this,iVar11,__addr,(socklen_t)in_RCX);
  __end1 = BufferLayout::begin(this_00);
  e = (BufferElement *)BufferLayout::end(this_00);
  do {
    __rhs = (__normal_iterator<const_BufferElement_*,_std::vector<BufferElement,_std::allocator<BufferElement>_>_>
             *)&e;
    bVar4 = __gnu_cxx::operator!=(&__end1,__rhs);
    if (!bVar4) {
      std::vector<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>::
      push_back(&this->m_vertexBuffers,vbo);
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_BufferElement_*,_std::vector<BufferElement,_std::allocator<BufferElement>_>_>
              ::operator*(&__end1);
    iVar11 = (int)__rhs;
    sVar9 = (socklen_t)in_RCX;
    EVar1 = this_01->type;
    if (EVar1 < Mat3) {
LAB_00131147:
      peVar8 = std::__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)vbo);
      VertexBuffer::bind(peVar8,iVar11,__addr_00,sVar9);
      p_Var3 = glad_glVertexAttribPointer;
      GVar2 = this->binding_index;
      uVar5 = BufferElement::components_count(this_01);
      GVar6 = element_to_shader_type(this_01->type);
      bVar4 = this_01->normalized;
      uVar7 = BufferLayout::get_stride(this_00);
      (*p_Var3)(GVar2,uVar5,GVar6,(bVar4 & 1U) != 0,uVar7,(void *)(ulong)this_01->offset);
      (*glad_glEnableVertexAttribArray)(this->binding_index);
      if (instanced) {
        (*glad_glVertexAttribDivisor)(this->binding_index,1);
      }
      uVar10 = this->binding_index + 1;
      in_RCX = (ulong)uVar10;
      this->binding_index = uVar10;
    }
    else if (EVar1 - Mat3 < 2) {
      uVar5 = BufferElement::components_count(this_01);
      local_4a = 0;
      while( true ) {
        iVar11 = (int)__rhs;
        in_RCX = (ulong)(byte)uVar5;
        sVar9 = uVar5 & 0xff;
        if ((byte)uVar5 <= local_4a) break;
        peVar8 = std::__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)vbo);
        VertexBuffer::bind(peVar8,iVar11,__addr_01,sVar9);
        p_Var3 = glad_glVertexAttribPointer;
        GVar2 = this->binding_index;
        GVar6 = element_to_shader_type(this_01->type);
        bVar4 = this_01->normalized;
        uVar7 = BufferLayout::get_stride(this_00);
        (*p_Var3)(GVar2,uVar5 & 0xff,GVar6,(bVar4 & 1U) != 0,uVar7,
                  (void *)((ulong)this_01->offset + (long)(int)((uint)local_4a * (uVar5 & 0xff)) * 4
                          ));
        (*glad_glEnableVertexAttribArray)(this->binding_index);
        __rhs = (__normal_iterator<const_BufferElement_*,_std::vector<BufferElement,_std::allocator<BufferElement>_>_>
                 *)0x1;
        (*glad_glVertexAttribDivisor)(this->binding_index,1);
        this->binding_index = this->binding_index + 1;
        local_4a = local_4a + 1;
      }
    }
    else if (EVar1 - Int < 10) goto LAB_00131147;
    __gnu_cxx::
    __normal_iterator<const_BufferElement_*,_std::vector<BufferElement,_std::allocator<BufferElement>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void VertexArray::add_vertex_buffer(const std::shared_ptr<VertexBuffer>& vbo, 
                                    bool instanced)
{
    const auto& layout = vbo->layout();
    massert(layout.get_elements().size(), "Vertex buffer has no buffer elements!");

    bind();

    for (const auto& e : layout)
    {
        switch(e.type)
        {
            case ElementType::Float: 
            case ElementType::Float2:
            case ElementType::Float3:
            case ElementType::Float4:
            case ElementType::Int:   
            case ElementType::Int2:  
            case ElementType::Int3:  
            case ElementType::Int4:  
            case ElementType::UInt8:
            case ElementType::UInt8_2:
            case ElementType::UInt8_3:
            case ElementType::UInt: 
            case ElementType::UInt2: 
            case ElementType::UInt3: 
            case ElementType::Bool:  
            {
#if OPENGL_VERSION >= 45
                // TODO offset x relativeoffset
                glVertexArrayVertexBuffer(m_id, binding_index, vbo->ID(), 
                                          0, layout.get_stride());
                glEnableVertexArrayAttrib(m_id, binding_index);

                glVertexArrayAttribFormat(m_id, binding_index, 
                                          e.components_count(), 
                                          element_to_shader_type(e.type),
                                          e.normalized ? GL_TRUE : GL_FALSE, 
                                          e.offset);
                glVertexArrayAttribBinding(m_id, binding_index, binding_index);
#elif OPENGL_VERSION >= 43
                glBindVertexBuffer(binding_index, vbo->ID(), 
                                   0, layout.get_stride());            
                glEnableVertexAttribArray(binding_index);

                glVertexAttribFormat(binding_index, 
                                     e.components_count(), 
                                     element_to_shader_type(e.type),
                                     e.normalized ? GL_TRUE : GL_FALSE, 
                                     e.offset);
                glVertexAttribBinding(binding_index, binding_index);
#else
                vbo->bind();
                glVertexAttribPointer(binding_index, 
                                      e.components_count(), 
                                      element_to_shader_type(e.type),
                                      e.normalized ? GL_TRUE : GL_FALSE, 
                                      layout.get_stride(),
                                      (void*)e.offset);
                glEnableVertexAttribArray(binding_index);
#endif

                if (instanced)
                    glVertexAttribDivisor(binding_index, 1);

                binding_index++;
                break;
            }
            case ElementType::Mat3:  
            case ElementType::Mat4:  
            {
                uint8_t count = e.components_count();
                for (uint8_t i = 0; i < count; ++i)
                {
#if OPENGL_VERSION >= 45
                    glVertexArrayVertexBuffer(m_id, binding_index, vbo->ID(), 
                                              0, layout.get_stride());
                    glEnableVertexArrayAttrib(m_id, binding_index);

                    glVertexArrayAttribFormat(m_id, binding_index, 
                                              count, 
                                              element_to_shader_type(e.type),
                                              e.normalized ? GL_TRUE : GL_FALSE, 
                                              e.offset + i * count * sizeof(float));
                    glVertexArrayAttribBinding(m_id, binding_index, binding_index);
#elif OPENGL_VERSION >= 43
                    glBindVertexBuffer(binding_index, vbo->ID(), 
                                       0, layout.get_stride());            
                    glEnableVertexAttribArray(binding_index);

                    glVertexAttribFormat(binding_index, 
                                         count, 
                                         element_to_shader_type(e.type),
                                         e.normalized ? GL_TRUE : GL_FALSE, 
                                         e.offset + i * count * sizeof(float));
                    glVertexAttribBinding(binding_index, binding_index);
#else
                    vbo->bind();
                    glVertexAttribPointer(binding_index, 
                                          count, 
                                          element_to_shader_type(e.type),
                                          e.normalized ? GL_TRUE : GL_FALSE, 
                                          layout.get_stride(),
                                          (void*)(e.offset + i * count * sizeof(float)));

                    glEnableVertexAttribArray(binding_index);
#endif
                    // Per instance (GLSL vec4 limitation)
                    glVertexAttribDivisor(binding_index, 1);

                    binding_index++;
                }
                break;
            }
            default:
                massert(false, "Unknown buffer element data type!");
        }
    }

    m_vertexBuffers.push_back(vbo);
}